

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-store.c
# Opt level: O0

void store_redraw(store_context *ctx)

{
  char *str;
  store_context *ctx_local;
  
  if ((ctx->flags & 2U) != 0) {
    store_display_frame(ctx);
    if ((ctx->flags & 4U) == 0) {
      prt("Press \'?\' for help.",ctx->scr_places_y[5],L'\x01');
    }
    else {
      store_display_help(ctx);
    }
    ctx->flags = ctx->flags & 0xfffffffd;
  }
  if ((ctx->flags & 1U) != 0) {
    str = format("Gold Remaining: %9ld",(long)player->au);
    prt(str,ctx->scr_places_y[6],ctx->scr_places_x[6]);
    ctx->flags = ctx->flags & 0xfffffffe;
  }
  return;
}

Assistant:

static void store_redraw(struct store_context *ctx)
{
	if (ctx->flags & (STORE_FRAME_CHANGE)) {
		store_display_frame(ctx);

		if (ctx->flags & STORE_SHOW_HELP)
			store_display_help(ctx);
		else
			prt("Press '?' for help.", ctx->scr_places_y[LOC_HELP_PROMPT], 1);

		ctx->flags &= ~(STORE_FRAME_CHANGE);
	}

	if (ctx->flags & (STORE_GOLD_CHANGE)) {
		prt(format("Gold Remaining: %9ld", (long)player->au),
				ctx->scr_places_y[LOC_AU], ctx->scr_places_x[LOC_AU]);
		ctx->flags &= ~(STORE_GOLD_CHANGE);
	}
}